

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O0

uint64_t __thiscall tcmalloc::PageHeap::ReleaseSpan(PageHeap *this,Span *span)

{
  bool bVar1;
  Span *span_00;
  uint64_t old_pages;
  Span *span_local;
  PageHeap *this_local;
  
  if (span->location != 1) {
    __assert_fail("span->location == Span::IN_NORMAL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                  ,0x131,"uint64_t tcmalloc::PageHeap::ReleaseSpan(Span *)");
  }
  bVar1 = SystemRelease((void *)(span->page_id << 0xd),span->npages << 0xd);
  if (bVar1) {
    this_local = (PageHeap *)span->npages;
    RemoveFromFreeList(this,span);
    span->location = 2;
    bVar1 = CheckSmallList(this);
    if (!bVar1) {
      __assert_fail("CheckSmallList()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0x13b,"uint64_t tcmalloc::PageHeap::ReleaseSpan(Span *)");
    }
    span_00 = MergePrevAndNextSpans(this,span);
    bVar1 = CheckSmallList(this);
    if (!bVar1) {
      __assert_fail("CheckSmallList()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0x13d,"uint64_t tcmalloc::PageHeap::ReleaseSpan(Span *)");
    }
    InsertToFreeList(this,span_00);
    bVar1 = CheckSmallList(this);
    if (!bVar1) {
      __assert_fail("CheckSmallList()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0x13f,"uint64_t tcmalloc::PageHeap::ReleaseSpan(Span *)");
    }
  }
  else {
    this_local = (PageHeap *)0x0;
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t ReleaseSpan(Span* span) {
        assert(span->location == Span::IN_NORMAL);
        if (!SystemRelease(
                reinterpret_cast<void *>(span->page_id * spanPageSize),
                span->npages * spanPageSize))
        {
            return 0;
        }
        uint64_t old_pages = span->npages;
        RemoveFromFreeList(span);
        span->location = Span::IN_RETURNED;
        assert(CheckSmallList());
        span = MergePrevAndNextSpans(span);
        assert(CheckSmallList());
        InsertToFreeList(span);
        assert(CheckSmallList());
        return old_pages;
    }